

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::WhileStatement(SQCompiler *this)

{
  SQFuncState *pSVar1;
  long lVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  SQUnsignedInteger SVar5;
  SQObject SVar6;
  SQInteger oldouters;
  SQScope __oldscope__;
  longlong local_58;
  SQUnsignedInteger local_50;
  SQInteger __ncontinues__;
  SQInteger __nbreaks__;
  SQObjectValue local_38;
  SQObjectType local_30;
  SQObjectValue local_28;
  SQInteger local_20;
  SQInteger jmppos;
  SQInteger jzpos;
  SQCompiler *this_local;
  
  jzpos = (SQInteger)this;
  local_20 = SQFuncState::GetCurrentPos(this->_fs);
  Lex(this);
  SVar6 = Expect(this,0x28);
  local_28 = SVar6._unVal;
  local_30 = SVar6._type;
  CommaExpr(this);
  SVar6 = Expect(this,0x29);
  local_38 = SVar6._unVal;
  __nbreaks__._0_4_ = SVar6._type;
  __ncontinues__ = sqvector<long_long>::size(&this->_fs->_unresolvedbreaks);
  local_50 = sqvector<long_long>::size(&this->_fs->_unresolvedcontinues);
  local_58 = 0;
  sqvector<long_long>::push_back(&this->_fs->_breaktargets,&local_58);
  __oldscope__.stacksize = 0;
  sqvector<long_long>::push_back(&this->_fs->_continuetargets,&__oldscope__.stacksize);
  pSVar1 = this->_fs;
  SVar3 = SQFuncState::PopTarget(this->_fs);
  SQFuncState::AddInstruction(pSVar1,_OP_JZ,SVar3,0,0,0);
  jmppos = SQFuncState::GetCurrentPos(this->_fs);
  SVar3 = (this->_scope).outers;
  __oldscope__.outers = (this->_scope).stacksize;
  (this->_scope).outers = this->_fs->_outers;
  SVar4 = SQFuncState::GetStackSize(this->_fs);
  (this->_scope).stacksize = SVar4;
  Statement(this,true);
  lVar2 = this->_fs->_outers;
  SVar4 = SQFuncState::GetStackSize(this->_fs);
  if ((SVar4 != (this->_scope).stacksize) &&
     (SQFuncState::SetStackSize(this->_fs,(this->_scope).stacksize), lVar2 != this->_fs->_outers)) {
    SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
  }
  SVar4 = local_20;
  (this->_scope).outers = SVar3;
  (this->_scope).stacksize = __oldscope__.outers;
  pSVar1 = this->_fs;
  SVar3 = SQFuncState::GetCurrentPos(this->_fs);
  SQFuncState::AddInstruction(pSVar1,_OP_JMP,0,(SVar4 - SVar3) + -1,0,0);
  SVar3 = jmppos;
  pSVar1 = this->_fs;
  SVar4 = SQFuncState::GetCurrentPos(this->_fs);
  SQFuncState::SetIntructionParam(pSVar1,SVar3,1,SVar4 - jmppos);
  SVar5 = sqvector<long_long>::size(&this->_fs->_unresolvedbreaks);
  __ncontinues__ = SVar5 - __ncontinues__;
  SVar5 = sqvector<long_long>::size(&this->_fs->_unresolvedcontinues);
  local_50 = SVar5 - local_50;
  if (0 < (long)local_50) {
    ResolveContinues(this,this->_fs,local_50,local_20);
  }
  if (0 < __ncontinues__) {
    ResolveBreaks(this,this->_fs,__ncontinues__);
  }
  sqvector<long_long>::pop_back(&this->_fs->_breaktargets);
  sqvector<long_long>::pop_back(&this->_fs->_continuetargets);
  return;
}

Assistant:

void WhileStatement()
    {
        SQInteger jzpos, jmppos;
        jmppos = _fs->GetCurrentPos();
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));

        BEGIN_BREAKBLE_BLOCK();
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        jzpos = _fs->GetCurrentPos();
        BEGIN_SCOPE();

        Statement();

        END_SCOPE();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKBLE_BLOCK(jmppos);
    }